

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O1

int Abc_NtkDarReach(Abc_Ntk_t *pNtk,Saig_ParBbr_t *pPars)

{
  int iVar1;
  Aig_Man_t *pInit;
  
  pInit = Abc_NtkToDar(pNtk,0,1);
  if (pInit == (Aig_Man_t *)0x0) {
    iVar1 = -1;
  }
  else {
    iVar1 = Aig_ManVerifyUsingBdds(pInit,pPars);
    if (pNtk->pModel != (int *)0x0) {
      free(pNtk->pModel);
      pNtk->pModel = (int *)0x0;
    }
    if (pNtk->pSeqModel != (Abc_Cex_t *)0x0) {
      free(pNtk->pSeqModel);
      pNtk->pSeqModel = (Abc_Cex_t *)0x0;
    }
    pNtk->pSeqModel = pInit->pSeqModel;
    pInit->pSeqModel = (Abc_Cex_t *)0x0;
    Aig_ManStop(pInit);
  }
  return iVar1;
}

Assistant:

int Abc_NtkDarReach( Abc_Ntk_t * pNtk, Saig_ParBbr_t * pPars )
{
    Aig_Man_t * pMan;
    int RetValue;
    pMan = Abc_NtkToDar( pNtk, 0, 1 );
    if ( pMan == NULL )
        return -1;
    RetValue = Aig_ManVerifyUsingBdds( pMan, pPars );
    ABC_FREE( pNtk->pModel );
    ABC_FREE( pNtk->pSeqModel );
    pNtk->pSeqModel = pMan->pSeqModel; pMan->pSeqModel = NULL;
    Aig_ManStop( pMan );
    return RetValue;
}